

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_audio_buffer_get_available_frames
                    (ma_audio_buffer *pAudioBuffer,ma_uint64 *pAvailableFrames)

{
  ma_uint64 *pmVar1;
  ulong uVar2;
  ma_result mVar3;
  ma_uint64 mVar4;
  
  mVar3 = MA_INVALID_ARGS;
  if ((pAvailableFrames != (ma_uint64 *)0x0) &&
     (*pAvailableFrames = 0, pAudioBuffer != (ma_audio_buffer *)0x0)) {
    uVar2 = (pAudioBuffer->ref).sizeInFrames;
    mVar3 = MA_SUCCESS;
    pmVar1 = &(pAudioBuffer->ref).cursor;
    mVar4 = 0;
    if (*pmVar1 <= uVar2) {
      mVar4 = uVar2 - *pmVar1;
    }
    *pAvailableFrames = mVar4;
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_audio_buffer_get_available_frames(const ma_audio_buffer* pAudioBuffer, ma_uint64* pAvailableFrames)
{
    if (pAvailableFrames == NULL) {
        return MA_INVALID_ARGS;
    }

    *pAvailableFrames = 0;

    if (pAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_audio_buffer_ref_get_available_frames(&pAudioBuffer->ref, pAvailableFrames);
}